

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_rope(ggml_context *ctx,ggml_tensor *a,int n_past,int n_dims,int mode)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  undefined4 in_ECX;
  int in_EDX;
  ggml_tensor *in_RSI;
  undefined4 in_R8D;
  ggml_tensor *b;
  ggml_tensor *result;
  _Bool is_node;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_context *in_stack_ffffffffffffffd0;
  
  if (in_EDX < 0) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xfe5,
            "n_past >= 0");
    abort();
  }
  if (in_RSI->grad == (ggml_tensor *)0x0) {
    pgVar1 = ggml_view_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    pgVar2 = ggml_new_tensor_1d(in_stack_ffffffffffffffd0,
                                (ggml_type)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                                (int)in_stack_ffffffffffffffc8);
    *(int *)pgVar2->data = in_EDX;
    *(undefined4 *)((long)pgVar2->data + 4) = in_ECX;
    *(undefined4 *)((long)pgVar2->data + 8) = in_R8D;
    pgVar1->op = GGML_OP_ROPE;
    pgVar1->grad = (ggml_tensor *)0x0;
    pgVar1->src0 = in_RSI;
    pgVar1->src1 = pgVar2;
    return pgVar1;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xfe9,
          "false");
  abort();
}

Assistant:

struct ggml_tensor * ggml_rope(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   n_past,
        int                   n_dims,
        int                   mode) {
    GGML_ASSERT(n_past >= 0);
    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    // TODO: when implement backward, fix this:
    //struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);
    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    struct ggml_tensor * b = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, 3);
    ((int32_t *) b->data)[0] = n_past;
    ((int32_t *) b->data)[1] = n_dims;
    ((int32_t *) b->data)[2] = mode;

    result->op   = GGML_OP_ROPE;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}